

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<long,_int,_17>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (long *lhs,int *rhs,int *result)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int *unaff_retaddr;
  int64_t tmp;
  
  lVar2 = *in_RDI;
  iVar1 = *in_RSI;
  if (SBORROW8(lVar2,(long)iVar1)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if (*in_RDI < 0) {
    bVar4 = subtract_corner_case_max<int,_long,_true>::isOverflowNegative
                      (unaff_retaddr,in_RDI,(int64_t)in_RSI);
    if (bVar4) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  else {
    bVar4 = subtract_corner_case_max<int,_long,_true>::isOverflowPositive
                      (unaff_retaddr,in_RDI,(int64_t)in_RSI);
    if (bVar4) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  *in_RDX = (int)lVar2 - iVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs std::int64_t, rhs any signed int (including std::int64_t)
        std::int64_t tmp = lhs - rhs;

        // we have essentially 4 cases:
        //
        // 1) lhs positive, rhs positive - overflow not possible in tmp
        // 2) lhs positive, rhs negative - equivalent to addition - result >= lhs or error
        // 3) lhs negative, rhs positive - check result <= lhs
        // 4) lhs negative, rhs negative - overflow not possible in tmp

        if( lhs >= 0 )
        {
            // if both positive, overflow to negative not possible
            // which is why we'll explicitly check maxInt, and not call SafeCast
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit>::isOverflowPositive(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }
        else
        {
            // lhs negative
            if (subtract_corner_case_max< T, U, safeint_internal::int_traits< T >::isLT64Bit >::isOverflowNegative(rhs, lhs, tmp))
            {
                E::SafeIntOnOverflow();
            }
        }

        result = (T)tmp;
    }